

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O3

void __thiscall chrono::turtlebot::Turtlebot_Part::AddCollisionShapes(Turtlebot_Part *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long *plVar4;
  long *plVar5;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  string vis_mesh_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  long *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_110;
  element_type *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0;
  long local_c8;
  long lStack_c0;
  long lStack_b8;
  undefined8 uStack_b0;
  undefined1 auStack_a8 [24];
  undefined8 local_90;
  double local_88;
  double dStack_80;
  double local_78;
  undefined8 local_68;
  undefined1 auStack_60 [24];
  undefined8 local_48;
  undefined1 auStack_40 [24];
  undefined8 local_28;
  
  std::operator+(&local_138,"robot/turtlebot/",&this->m_mesh_name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_138);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    lStack_c0 = *plVar5;
    lStack_b8 = plVar4[3];
    local_d0 = &lStack_c0;
  }
  else {
    lStack_c0 = *plVar5;
    local_d0 = (long *)*plVar4;
  }
  local_c8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  chrono::GetChronoDataFile((string *)local_f0);
  if (local_d0 != &lStack_c0) {
    operator_delete(local_d0,lStack_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)&local_138,SUB81(local_f0,0),false);
  local_88 = (this->m_offset).m_data[0];
  dStack_80 = (this->m_offset).m_data[1];
  local_78 = (this->m_offset).m_data[2];
  auStack_60 = SUB3224(ZEXT832(0),0) << 0x20;
  auStack_40 = SUB3224(ZEXT832(0),4);
  local_68 = 0x3ff0000000000000;
  local_48 = 0x3ff0000000000000;
  local_28 = 0x3ff0000000000000;
  (**(code **)(*(long *)local_138._M_dataplus._M_p + 0x80))();
  peVar1 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  plVar4 = *(long **)(peVar1 + 0x198);
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar1 + 0x1a0);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar4 + 0x18))();
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  peVar1 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  plVar4 = *(long **)(peVar1 + 0x198);
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar1 + 0x1a0);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_108 = (this->m_mat).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Stack_100 = (this->m_mat).
                super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  p_Var3 = (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_118 = (long *)local_138._M_dataplus._M_p;
  p_Stack_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_138._M_string_length + 8) =
           *(_Atomic_word *)(local_138._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_138._M_string_length + 8) =
           *(_Atomic_word *)(local_138._M_string_length + 8) + 1;
    }
  }
  local_c8 = 0;
  auStack_a8 = SUB3224(ZEXT832(0),4);
  lStack_c0 = SUB328(ZEXT832(0),4);
  lStack_b8 = 0;
  local_d0 = (long *)0x3ff0000000000000;
  uStack_b0 = 0x3ff0000000000000;
  local_90 = 0x3ff0000000000000;
  (**(code **)(*plVar4 + 0x80))(plVar4,&local_108,&local_118,0,0,&VNULL,&local_d0);
  if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
  }
  if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  peVar1 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  plVar4 = *(long **)(peVar1 + 0x198);
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar1 + 0x1a0);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar4 + 0x20))();
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  chrono::ChBody::SetCollide
            (SUB81((this->m_body).
                   super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  return;
}

Assistant:

void Turtlebot_Part::AddCollisionShapes() {
    auto vis_mesh_file = GetChronoDataFile("robot/turtlebot/" + m_mesh_name + ".obj");
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(vis_mesh_file, false, false);
    trimesh->Transform(m_offset, ChMatrix33<>(1));

    m_body->GetCollisionModel()->ClearModel();
    m_body->GetCollisionModel()->AddTriangleMesh(m_mat, trimesh, false, false, VNULL, ChMatrix33<>(1), 0.005);
    m_body->GetCollisionModel()->BuildModel();
    m_body->SetCollide(m_collide);
}